

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O1

Variable * parse_variable(Variable *__return_storage_ptr__,string *var)

{
  long lVar1;
  runtime_error *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string type;
  string name;
  string local_68;
  long *local_48;
  size_type sStack_40;
  long local_38 [3];
  
  lVar1 = std::__cxx11::string::rfind((char)var,0x3a);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&local_68,(ulong)var);
    std::__cxx11::string::substr((ulong)&local_48,(ulong)var);
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_48,sStack_40 + (long)local_48);
    (__return_storage_ptr__->type)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->type).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->type,local_68._M_dataplus._M_p,
               local_68._M_dataplus._M_p + local_68._M_string_length);
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_48 = (long *)(var->_M_dataplus)._M_p;
  sStack_40 = var->_M_string_length;
  fmt.size_ = 0xd;
  fmt.data_ = (char *)0x25;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_48;
  ::fmt::v8::vformat_abi_cxx11_(&local_68,(v8 *)"Couldn\'t find type of variable in {}\n",fmt,args);
  std::runtime_error::runtime_error(this,(string *)&local_68);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Variable parse_variable(const std::string& var)
{
    // parse the variable
    size_t colon = var.rfind(':');
    if (colon == std::string::npos)
        throw std::runtime_error(fmt::format("Couldn't find type of variable in {}\n", var));

    std::string type = var.substr(colon+1);
    std::string name = var.substr(0,colon);

    Variable v = { name, type };
    return v;
}